

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetMemoryAccessProperties
          (ze_device_handle_t hDevice,ze_device_memory_access_properties_t *pMemAccessProperties)

{
  ze_pfnDeviceGetMemoryAccessProperties_t pfnGetMemoryAccessProperties;
  ze_result_t result;
  ze_device_memory_access_properties_t *pMemAccessProperties_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetMemoryAccessProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c250 != (code *)0x0) {
    pfnGetMemoryAccessProperties._4_4_ = (*DAT_0011c250)(hDevice,pMemAccessProperties);
  }
  return pfnGetMemoryAccessProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetMemoryAccessProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        ze_device_memory_access_properties_t* pMemAccessProperties  ///< [in,out] query result for memory access properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetMemoryAccessProperties = context.zeDdiTable.Device.pfnGetMemoryAccessProperties;
        if( nullptr != pfnGetMemoryAccessProperties )
        {
            result = pfnGetMemoryAccessProperties( hDevice, pMemAccessProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }